

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbedFromSearchPath
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,PathPtr path)

{
  ReadableDirectory **ppRVar1;
  NullableValue<kj::Array<const_unsigned_char>_> *other;
  Array<const_unsigned_char> *pAVar2;
  Array<const_unsigned_char> *pAVar3;
  Maybe<kj::Array<const_unsigned_char>_> local_88;
  undefined1 local_68 [8];
  NullableValue<kj::Array<const_unsigned_char>_> module;
  ReadableDirectory *candidate;
  ReadableDirectory **__end2;
  ReadableDirectory **__begin2;
  Vector<const_kj::ReadableDirectory_*> *__range2;
  Impl *this_local;
  PathPtr path_local;
  
  __end2 = kj::Vector<const_kj::ReadableDirectory_*>::begin(&this->searchPath);
  ppRVar1 = kj::Vector<const_kj::ReadableDirectory_*>::end(&this->searchPath);
  while( true ) {
    if (__end2 == ppRVar1) {
      kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,(void *)0x0);
      return __return_storage_ptr__;
    }
    module.field_1.value.disposer = (ArrayDisposer *)*__end2;
    readEmbed(&local_88,this,(ReadableDirectory *)module.field_1.value.disposer,path);
    other = kj::_::readMaybe<kj::Array<unsigned_char_const>>(&local_88);
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::NullableValue
              ((NullableValue<kj::Array<const_unsigned_char>_> *)local_68,other);
    kj::Maybe<kj::Array<const_unsigned_char>_>::~Maybe(&local_88);
    pAVar2 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_68);
    if (pAVar2 != (Array<const_unsigned_char> *)0x0) {
      pAVar3 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator*
                         ((NullableValue<kj::Array<const_unsigned_char>_> *)local_68);
      pAVar3 = kj::mv<kj::Array<unsigned_char_const>>(pAVar3);
      kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,pAVar3);
    }
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue
              ((NullableValue<kj::Array<const_unsigned_char>_> *)local_68);
    if (pAVar2 != (Array<const_unsigned_char> *)0x0) break;
    __end2 = __end2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbedFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_MAYBE(module, readEmbed(*candidate, path)) {
      return kj::mv(*module);
    }
  }
  return nullptr;
}